

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

uint32_t predict_sublearner_adf(warm_cb *data,multi_learner *base,example *ec,uint32_t i)

{
  copy_example_to_adf(data,ec);
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
            (base,&data->ecs,(ulong)i);
  return (((*(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
             super__Vector_impl_data._M_start)->pred).a_s._begin)->action + 1;
}

Assistant:

uint32_t predict_sublearner_adf(warm_cb& data, multi_learner& base, example& ec, uint32_t i)
{
	copy_example_to_adf(data, ec);
	base.predict(data.ecs, i);
	return data.ecs[0]->pred.a_s[0].action+1;
}